

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O0

void __thiscall Car::add_node(Car *this,Node *a,double **matrix)

{
  bool bVar1;
  value_type *in_RDX;
  vector<Node,_std::allocator<Node>_> *in_RSI;
  long in_RDI;
  
  bVar1 = std::vector<Node,_std::allocator<Node>_>::empty(in_RSI);
  if (!bVar1) {
    *(int *)(in_RDI + 0x10) =
         (int)*(double *)
               (*(long *)(&in_RDX->x + (long)*(int *)(in_RDI + 8) * 2) +
               (long)*(int *)&(in_RSI->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                              super__Vector_impl_data._M_finish * 8) / *(int *)(in_RDI + 0xc) +
         *(int *)(in_RDI + 0x10);
    *(int *)(in_RDI + 0x10) =
         *(int *)((long)&in_RSI[1].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_start + 4) + *(int *)(in_RDI + 0x10);
  }
  std::vector<Node,_std::allocator<Node>_>::push_back(in_RSI,in_RDX);
  *(int *)(in_RDI + 4) =
       *(int *)((long)&(in_RSI->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                       super__Vector_impl_data._M_finish + 4) + *(int *)(in_RDI + 4);
  *(undefined4 *)(in_RDI + 8) =
       *(undefined4 *)
        &(in_RSI->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
  *(undefined1 *)
   &(in_RSI->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = 1;
  return;
}

Assistant:

void Car::add_node(Node *a, double** matrix)
{
	if(!tour.empty()){// though the tour first adds the depot, it doesnt count time 
		now_time += (int)matrix[now_idx][a->idx] / car_speed;
		now_time += a->unload_time;	
	}
	tour.push_back(*a);
	now_load += a->demand;
	now_idx = a->idx;
	a->visited = true;
}